

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::CmpHelperOpFailure<float,float>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *op,
          float *val1,float *val2)

{
  AssertionResult *pAVar1;
  string local_b0;
  string local_90;
  AssertionResult local_60;
  internal *local_38;
  float *val2_local;
  float *val1_local;
  char *op_local;
  char *expr2_local;
  char *expr1_local;
  
  local_38 = (internal *)val1;
  val2_local = (float *)op;
  val1_local = (float *)expr2;
  op_local = expr1;
  expr2_local = (char *)this;
  expr1_local = (char *)__return_storage_ptr__;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_60,(char (*) [18])"error: Expected: ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x174407);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&val1_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x174407);
  pAVar1 = AssertionResult::operator<<(pAVar1,&op_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
  FormatForComparisonFailureMessage<float,float>
            (&local_90,(internal *)val2_local,(float *)local_38,(float *)expr2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_90);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  FormatForComparisonFailureMessage<float,float>(&local_b0,local_38,val2_local,(float *)expr2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_b0);
  AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  AssertionResult::~AssertionResult(&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2, const char* op
    , const T1& val1, const T2& val2)
{
    return AssertionFailure() << "error: Expected: " << expr1 << " " << op << " " << expr2
        << "\n  Actual: " << FormatForComparisonFailureMessage(val1, val2)
        << " vs " << FormatForComparisonFailureMessage(val2, val1);
}